

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O3

string * __thiscall
CJSON::ParseNull_abi_cxx11_(string *__return_storage_ptr__,CJSON *this,char **beg,char **end)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  CJSONException *this_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = *beg;
  if (pcVar3 != *end) {
    do {
      cVar1 = *pcVar3;
      if (((cVar1 == ',') || (cVar1 == ']')) || (cVar1 == '}')) break;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      pcVar3 = *beg + 1;
      *beg = pcVar3;
    } while (pcVar3 != *end);
  }
  *beg = pcVar3 + -1;
  iVar2 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if (iVar2 != 0) {
    this_00 = (CJSONException *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Expected null","");
    CJSONException::CJSONException(this_00,&local_50,EXPECTED_NULL);
    __cxa_throw(this_00,&CJSONException::typeinfo,CJSONException::~CJSONException);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string ParseNull(const char *&beg, const char *&end)
        {
            std::string Ret;

            while (beg != end)
            {
                if(*beg == ',' || *beg == '}' || *beg == ']')
                    break;

                Ret += *beg;

                beg++;
            } 

            beg--;

            if(Ret != "null")
                throw CJSONException("Expected null", JSONErrorType::EXPECTED_NULL);

            return Ret;
        }